

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

bool __thiscall llvm::yaml::Output::preflightFlowElement(Output *this,uint param_1,void **param_2)

{
  int iVar1;
  int iVar2;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  
  if (this->NeedFlowSequenceComma == true) {
    this->Column = this->Column + 2;
    Str.Length = 2;
    Str.Data = ", ";
    raw_ostream::operator<<(this->Out,Str);
  }
  if ((this->WrapColumn != 0) && (this->WrapColumn < this->Column)) {
    this->Column = this->Column + 1;
    Str_00.Length = 1;
    Str_00.Data = "\n";
    raw_ostream::operator<<(this->Out,Str_00);
    iVar1 = this->ColumnAtFlowStart;
    if (0 < iVar1) {
      iVar2 = 0;
      do {
        this->Column = this->Column + 1;
        Str_01.Length = 1;
        Str_01.Data = " ";
        raw_ostream::operator<<(this->Out,Str_01);
        iVar2 = iVar2 + 1;
        iVar1 = this->ColumnAtFlowStart;
      } while (iVar2 < iVar1);
    }
    this->Column = iVar1 + 2;
    Str_02.Length = 2;
    Str_02.Data = "  ";
    raw_ostream::operator<<(this->Out,Str_02);
  }
  return true;
}

Assistant:

bool Output::preflightFlowElement(unsigned, void *&) {
  if (NeedFlowSequenceComma)
    output(", ");
  if (WrapColumn && Column > WrapColumn) {
    output("\n");
    for (int i = 0; i < ColumnAtFlowStart; ++i)
      output(" ");
    Column = ColumnAtFlowStart;
    output("  ");
  }
  return true;
}